

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsPhiUsed(VmInstruction *phi,uint searchMarker)

{
  bool bVar1;
  uint uVar2;
  VmValue **ppVVar3;
  VmInstruction *phi_00;
  VmInstruction *instruction;
  uint userPos;
  uint searchMarker_local;
  VmInstruction *phi_local;
  
  if (phi->cmd != VM_INST_PHI) {
    __assert_fail("phi->cmd == VM_INST_PHI",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1782,"bool IsPhiUsed(VmInstruction *, unsigned int)");
  }
  if (phi->regVmSearchMarker != searchMarker) {
    phi->regVmSearchMarker = searchMarker;
    for (instruction._0_4_ = 0; uVar2 = SmallArray<VmValue_*,_8U>::size(&(phi->super_VmValue).users)
        , (uint)instruction < uVar2; instruction._0_4_ = (uint)instruction + 1) {
      ppVVar3 = SmallArray<VmValue_*,_8U>::operator[](&(phi->super_VmValue).users,(uint)instruction)
      ;
      phi_00 = getType<VmInstruction>(*ppVVar3);
      if (phi_00->cmd != VM_INST_PHI) {
        return true;
      }
      bVar1 = IsPhiUsed(phi_00,searchMarker);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsPhiUsed(VmInstruction *phi, unsigned searchMarker)
{
	assert(phi->cmd == VM_INST_PHI);

	if(phi->regVmSearchMarker == searchMarker)
		return false;

	phi->regVmSearchMarker = searchMarker;

	for(unsigned userPos = 0; userPos < phi->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(phi->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
		{
			if(IsPhiUsed(instruction, searchMarker))
				return true;
		}
		else
		{
			return true;
		}
	}

	return false;
}